

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

NestedCompositeComponents * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForMatrix
          (NestedCompositeComponents *__return_storage_ptr__,
          InterfaceVariableScalarReplacement *this,Instruction *interface_var_type,
          StorageClass storage_class,uint32_t extra_array_length)

{
  Op OVar1;
  IRContext *this_00;
  DefUseManager *def_use_mgr_00;
  Instruction *interface_var_type_00;
  undefined1 local_68 [8];
  NestedCompositeComponents scalar_vars_for_column;
  Instruction *column_type;
  uint32_t column_count;
  DefUseManager *def_use_mgr;
  uint32_t extra_array_length_local;
  StorageClass storage_class_local;
  Instruction *interface_var_type_local;
  InterfaceVariableScalarReplacement *this_local;
  NestedCompositeComponents *scalar_vars;
  
  OVar1 = opt::Instruction::opcode(interface_var_type);
  if (OVar1 != OpTypeMatrix) {
    __assert_fail("interface_var_type->opcode() == spv::Op::OpTypeMatrix",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x337,
                  "InterfaceVariableScalarReplacement::NestedCompositeComponents spvtools::opt::InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForMatrix(Instruction *, spv::StorageClass, uint32_t)"
                 );
  }
  this_00 = Pass::context(&this->super_Pass);
  def_use_mgr_00 = IRContext::get_def_use_mgr(this_00);
  column_type._4_4_ = opt::Instruction::GetSingleWordInOperand(interface_var_type,1);
  interface_var_type_00 = anon_unknown_0::GetMatrixColumnType(def_use_mgr_00,interface_var_type);
  scalar_vars_for_column.component_variable._7_1_ = 0;
  NestedCompositeComponents::NestedCompositeComponents(__return_storage_ptr__);
  while (column_type._4_4_ != 0) {
    CreateScalarInterfaceVarsForReplacement
              ((NestedCompositeComponents *)local_68,this,interface_var_type_00,storage_class,
               extra_array_length);
    NestedCompositeComponents::AddComponent
              (__return_storage_ptr__,(NestedCompositeComponents *)local_68);
    column_type._4_4_ = column_type._4_4_ - 1;
    NestedCompositeComponents::~NestedCompositeComponents((NestedCompositeComponents *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

InterfaceVariableScalarReplacement::NestedCompositeComponents
InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForMatrix(
    Instruction* interface_var_type, spv::StorageClass storage_class,
    uint32_t extra_array_length) {
  assert(interface_var_type->opcode() == spv::Op::OpTypeMatrix);

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t column_count = interface_var_type->GetSingleWordInOperand(
      kOpTypeMatrixColCountInOperandIndex);
  Instruction* column_type =
      GetMatrixColumnType(def_use_mgr, interface_var_type);

  NestedCompositeComponents scalar_vars;
  while (column_count > 0) {
    NestedCompositeComponents scalar_vars_for_column =
        CreateScalarInterfaceVarsForReplacement(column_type, storage_class,
                                                extra_array_length);
    scalar_vars.AddComponent(scalar_vars_for_column);
    --column_count;
  }
  return scalar_vars;
}